

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::MILSpec::NamedValueType::NamedValueType(NamedValueType *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NamedValueType_003a0178;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  if (this != (NamedValueType *)&_NamedValueType_default_instance_) {
    protobuf_MIL_2eproto::InitDefaults();
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->type_ = (ValueType *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

NamedValueType::NamedValueType()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_MIL_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.MILSpec.NamedValueType)
}